

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRAMAddr.cpp
# Opt level: O2

DRAMAddr * __thiscall
DRAMAddr::add(DRAMAddr *__return_storage_ptr__,DRAMAddr *this,size_t bank_increment,
             size_t row_increment,size_t column_increment)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = this->row;
  sVar2 = this->col;
  __return_storage_ptr__->bank = bank_increment + this->bank;
  __return_storage_ptr__->row = row_increment + sVar1;
  __return_storage_ptr__->col = column_increment + sVar2;
  return __return_storage_ptr__;
}

Assistant:

DRAMAddr DRAMAddr::add(size_t bank_increment, size_t row_increment, size_t column_increment) const {
  return {bank + bank_increment, row + row_increment, col + column_increment};
}